

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

void __thiscall
soul::AST::EndpointDeclaration::EndpointDeclaration
          (EndpointDeclaration *this,Allocator *a,Context *c,bool isInputEndpoint,EndpointType type)

{
  SourceCodeText *pSVar1;
  Scope *pSVar2;
  PoolItem *pPVar3;
  
  (this->super_ASTObject)._vptr_ASTObject = (_func_int **)&PTR__ASTObject_002f5eb0;
  (this->super_ASTObject).objectType = EndpointDeclaration;
  pSVar1 = (c->location).sourceCode.object;
  (this->super_ASTObject).context.location.sourceCode.object = pSVar1;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  pSVar2 = c->parentScope;
  (this->super_ASTObject).context.location.location.data = (c->location).location.data;
  (this->super_ASTObject).context.parentScope = pSVar2;
  (this->super_ASTObject)._vptr_ASTObject = (_func_int **)&PTR__EndpointDeclaration_002f7250;
  this->isInput = isInputEndpoint;
  (this->name).name = (string *)0x0;
  pPVar3 = PoolAllocator::allocateSpaceForObject(&a->pool,0x38);
  *(EndpointType *)&pPVar3->item = type;
  *(void ***)&pPVar3->field_0x18 = &pPVar3[1].item;
  pPVar3[1].size = 0;
  pPVar3[1].destructor = (DestructorFn *)0x2;
  pPVar3[2].size = 0;
  pPVar3->destructor =
       PoolAllocator::allocate<soul::AST::EndpointDetails,_soul::EndpointType_&>::
       anon_class_1_0_00000001::__invoke;
  (this->details).object = (EndpointDetails *)&pPVar3->item;
  (this->childPath).object = (ChildEndpointPath *)0x0;
  (this->annotation).properties.
  super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->annotation).properties.
  super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->annotation).properties.
  super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->needsToBeExposedInParent = false;
  this->isConsoleEndpoint = false;
  (this->generatedInput).object = (InputDeclaration *)0x0;
  (this->generatedOutput).object = (OutputDeclaration *)0x0;
  return;
}

Assistant:

EndpointDeclaration (Allocator& a, const Context& c, bool isInputEndpoint, EndpointType type)
            : ASTObject (ObjectType::EndpointDeclaration, c), isInput (isInputEndpoint),
                         details (a.allocate<EndpointDetails> (type)) {}